

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::fill<fmt::v7::detail::buffer_appender<char>,char>
          (buffer_appender<char> it,size_t n,fill_t<char> *fill)

{
  size_t __n;
  char *pcVar1;
  undefined8 local_40;
  size_t i;
  size_t fill_size;
  fill_t<char> *fill_local;
  size_t n_local;
  buffer_appender<char> it_local;
  
  __n = fill_t<char>::size(fill);
  if (__n == 1) {
    pcVar1 = fill_t<char>::operator[](fill,0);
    it_local = std::fill_n<fmt::v7::detail::buffer_appender<char>,unsigned_long,char>(it,n,pcVar1);
  }
  else {
    n_local = (size_t)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
      pcVar1 = fill_t<char>::data(fill);
      n_local = (size_t)std::
                        copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>
                                  (pcVar1,__n,(buffer_appender<char>)n_local);
    }
    it_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)n_local;
  }
  return (buffer_appender<char>)
         it_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}